

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

int cvCheckNvector(N_Vector tmpl)

{
  N_Vector tmpl_local;
  int local_4;
  
  if (((((tmpl->ops->nvclone == (_func_N_Vector_N_Vector *)0x0) ||
        (tmpl->ops->nvdestroy == (_func_void_N_Vector *)0x0)) ||
       (tmpl->ops->nvlinearsum ==
        (_func_void_sunrealtype_N_Vector_sunrealtype_N_Vector_N_Vector *)0x0)) ||
      ((((tmpl->ops->nvconst == (_func_void_sunrealtype_N_Vector *)0x0 ||
         (tmpl->ops->nvprod == (_func_void_N_Vector_N_Vector_N_Vector *)0x0)) ||
        ((tmpl->ops->nvdiv == (_func_void_N_Vector_N_Vector_N_Vector *)0x0 ||
         ((tmpl->ops->nvscale == (_func_void_sunrealtype_N_Vector_N_Vector *)0x0 ||
          (tmpl->ops->nvabs == (_func_void_N_Vector_N_Vector *)0x0)))))) ||
       (tmpl->ops->nvinv == (_func_void_N_Vector_N_Vector *)0x0)))) ||
     (((tmpl->ops->nvaddconst == (_func_void_N_Vector_sunrealtype_N_Vector *)0x0 ||
       (tmpl->ops->nvmaxnorm == (_func_sunrealtype_N_Vector *)0x0)) ||
      (tmpl->ops->nvwrmsnorm == (_func_sunrealtype_N_Vector_N_Vector *)0x0)))) {
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static sunbooleantype cvCheckNvector(N_Vector tmpl)
{
  if ((tmpl->ops->nvclone == NULL) || (tmpl->ops->nvdestroy == NULL) ||
      (tmpl->ops->nvlinearsum == NULL) || (tmpl->ops->nvconst == NULL) ||
      (tmpl->ops->nvprod == NULL) || (tmpl->ops->nvdiv == NULL) ||
      (tmpl->ops->nvscale == NULL) || (tmpl->ops->nvabs == NULL) ||
      (tmpl->ops->nvinv == NULL) || (tmpl->ops->nvaddconst == NULL) ||
      (tmpl->ops->nvmaxnorm == NULL) || (tmpl->ops->nvwrmsnorm == NULL))
  {
    return (SUNFALSE);
  }
  else { return (SUNTRUE); }
}